

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

void oonf_rfc5444_reconfigure_interface
               (oonf_rfc5444_interface *interf,oonf_packet_managed_config *config)

{
  oonf_packet_managed_config *poVar1;
  oonf_rfc5444_protocol *poVar2;
  oonf_rfc5444_target *poVar3;
  oonf_packet_managed_config *poVar4;
  int iVar5;
  oonf_rfc5444_target *poVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  oonf_packet_managed_config *poVar11;
  netaddr_str buf;
  
  poVar1 = &interf->_socket_config;
  poVar11 = poVar1;
  if (config != (oonf_packet_managed_config *)0x0) {
    oonf_packet_copy_managed_config(poVar1);
    strscpy((interf->_socket_config).interface,interf,0x10);
    poVar11 = config;
  }
  (interf->_socket_config).mesh = true;
  poVar2 = interf->protocol;
  uVar8 = (uint)poVar2->port;
  if ((interf->_socket_config).rawip == true) {
    (interf->_socket_config).port = 0;
    (interf->_socket_config).multicast_port = 0;
    (interf->_socket_config).protocol = poVar2->ip_proto;
    uVar9 = 0;
  }
  else {
    uVar9 = (interf->_socket_config).multicast_port;
    if (uVar9 == 0) {
      uVar9 = (uint)poVar2->port;
      (interf->_socket_config).multicast_port = uVar9;
    }
    if ((poVar2->fixed_local_port == true) && ((interf->_socket_config).port == 0)) {
      (interf->_socket_config).port = uVar8;
    }
  }
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x2d1,0,0,
             "Reconfigure RFC5444 interface %s to port %u/%u and protocol %d",interf,
             (interf->_socket_config).port,uVar9,(interf->_socket_config).protocol);
  }
  iVar5 = strcmp(interf->name,"any");
  if (iVar5 == 0) {
    *(undefined8 *)&(interf->_socket_config).multicast_v4._type = 0;
    poVar4 = &interf->_socket_config;
    (poVar4->multicast_v6)._addr[6] = '\0';
    (poVar4->multicast_v6)._addr[7] = '\0';
    (poVar4->multicast_v6)._addr[8] = '\0';
    (poVar4->multicast_v6)._addr[9] = '\0';
    (poVar4->multicast_v6)._addr[10] = '\0';
    (poVar4->multicast_v6)._addr[0xb] = '\0';
    (poVar4->multicast_v6)._addr[0xc] = '\0';
    (poVar4->multicast_v6)._addr[0xd] = '\0';
    *(undefined4 *)((interf->_socket_config).multicast_v6._addr + 0xe) = 0;
    (interf->_socket_config).multicast_v4._addr[0] = '\0';
    (interf->_socket_config).multicast_v4._addr[1] = '\0';
    (interf->_socket_config).multicast_v4._addr[2] = '\0';
    (interf->_socket_config).multicast_v4._addr[3] = '\0';
    (interf->_socket_config).multicast_v4._addr[4] = '\0';
    (interf->_socket_config).multicast_v4._addr[5] = '\0';
    (interf->_socket_config).multicast_v4._addr[6] = '\0';
    (interf->_socket_config).multicast_v4._addr[7] = '\0';
    poVar4 = &interf->_socket_config;
    (poVar4->multicast_v4)._addr[8] = '\0';
    (poVar4->multicast_v4)._addr[9] = '\0';
    (poVar4->multicast_v4)._addr[10] = '\0';
    (poVar4->multicast_v4)._addr[0xb] = '\0';
    (poVar4->multicast_v4)._addr[0xc] = '\0';
    (poVar4->multicast_v4)._addr[0xd] = '\0';
    (poVar4->multicast_v4)._addr[0xe] = '\0';
    (poVar4->multicast_v4)._addr[0xf] = '\0';
    (interf->_socket_config).port = uVar8;
    (interf->_socket_config).interface[0] = '\0';
    netaddr_acl_from_strarray(&(interf->_socket_config).bindto,&_unicast_bindto_acl_value);
  }
  if (uVar8 == 0) {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) == 0) {
      return;
    }
    oonf_log(2,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x2de,0,0,
             "    delay configuration, we still lack to protocol port");
    return;
  }
  oonf_packet_apply_managed(&interf->_socket,poVar1);
  poVar3 = interf->multicast4;
  if (poVar3 != (oonf_rfc5444_target *)0x0) {
    interf->multicast4 = (oonf_rfc5444_target *)0x0;
  }
  if ((poVar11->multicast_v4)._type != '\0') {
    poVar6 = _create_target(interf,&poVar11->multicast_v4,false);
    if (poVar6 == (oonf_rfc5444_target *)0x0) {
      uVar10 = (ulong)_oonf_rfc5444_subsystem.logging;
      if (((&log_global_mask)[uVar10] & 4) != 0) {
        uVar7 = netaddr_to_prefixstring(&buf,&poVar11->multicast_v4,0);
        oonf_log(4,uVar10,"src/base/oonf_rfc5444.c",0x2f1,0,0,
                 "Could not create multicast target %s for interface %s",uVar7,interf);
      }
      interf->multicast4 = poVar3;
      goto LAB_00103de6;
    }
    interf->multicast4 = poVar6;
  }
  if (poVar3 != (oonf_rfc5444_target *)0x0) {
    _destroy_target(poVar3);
  }
LAB_00103de6:
  poVar3 = interf->multicast6;
  if (poVar3 != (oonf_rfc5444_target *)0x0) {
    interf->multicast6 = (oonf_rfc5444_target *)0x0;
  }
  if ((poVar11->multicast_v6)._type != '\0') {
    poVar6 = _create_target(interf,&poVar11->multicast_v6,false);
    if (poVar6 == (oonf_rfc5444_target *)0x0) {
      uVar10 = (ulong)_oonf_rfc5444_subsystem.logging;
      if (((&log_global_mask)[uVar10] & 4) != 0) {
        uVar7 = netaddr_to_prefixstring(&buf,&poVar11->multicast_v6,0);
        oonf_log(4,uVar10,"src/base/oonf_rfc5444.c",0x309,0,0,
                 "Could not create multicast socket %s for interface %s",uVar7,interf);
      }
      interf->multicast6 = poVar3;
      return;
    }
    interf->multicast6 = poVar6;
  }
  if (poVar3 != (oonf_rfc5444_target *)0x0) {
    _destroy_target(poVar3);
  }
  return;
}

Assistant:

void
oonf_rfc5444_reconfigure_interface(struct oonf_rfc5444_interface *interf, struct oonf_packet_managed_config *config) {
  struct oonf_rfc5444_target *target, *old;
  uint16_t port;
  struct netaddr_str buf;

  if (config != NULL) {
    /* copy socket configuration */
    oonf_packet_copy_managed_config(&interf->_socket_config, config);

    /* overwrite interface name */
    strscpy(interf->_socket_config.interface, interf->name, sizeof(interf->_socket_config.interface));
  }
  else {
    config = &interf->_socket_config;
  }

  /* always mesh socket */
  interf->_socket_config.mesh = true;

  /* get port */
  port = interf->protocol->port;

  /* set fixed configuration options */
  if (interf->_socket_config.rawip) {
    interf->_socket_config.port = 0;
    interf->_socket_config.multicast_port = 0;
    interf->_socket_config.protocol = interf->protocol->ip_proto;
  }
  else {
    if (interf->_socket_config.multicast_port == 0) {
      interf->_socket_config.multicast_port = port;
    }
    if (interf->protocol->fixed_local_port && interf->_socket_config.port == 0) {
      interf->_socket_config.port = port;
    }
  }

  OONF_INFO(LOG_RFC5444, "Reconfigure RFC5444 interface %s to port %u/%u and protocol %d", interf->name,
    interf->_socket_config.port, interf->_socket_config.multicast_port, interf->_socket_config.protocol);

  if (strcmp(interf->name, RFC5444_UNICAST_INTERFACE) == 0) {
    /* unicast interface */
    netaddr_invalidate(&interf->_socket_config.multicast_v4);
    netaddr_invalidate(&interf->_socket_config.multicast_v6);
    interf->_socket_config.port = port;
    interf->_socket_config.interface[0] = 0;
    netaddr_acl_from_strarray(&interf->_socket_config.bindto, &_unicast_bindto_acl_value);
  }

  if (port == 0) {
    /* delay configuration apply */
    OONF_INFO(LOG_RFC5444, "    delay configuration, we still lack to protocol port");
    return;
  }

  /* apply socket configuration */
  oonf_packet_apply_managed(&interf->_socket, &interf->_socket_config);

  /* handle IPv4 multicast target */
  if (interf->multicast4) {
    old = interf->multicast4;
    interf->multicast4 = NULL;
  }
  else {
    old = NULL;
  }
  if (netaddr_get_address_family(&config->multicast_v4) != AF_UNSPEC) {
    target = _create_target(interf, &config->multicast_v4, false);
    if (target == NULL) {
      OONF_WARN(LOG_RFC5444, "Could not create multicast target %s for interface %s",
        netaddr_to_string(&buf, &config->multicast_v4), interf->name);
      interf->multicast4 = old;
      old = NULL;
    }
    else {
      interf->multicast4 = target;
    }
  }
  if (old) {
    _destroy_target(old);
  }

  /* handle IPv6 multicast target */
  if (interf->multicast6) {
    old = interf->multicast6;
    interf->multicast6 = NULL;
  }
  else {
    old = NULL;
  }
  if (netaddr_get_address_family(&config->multicast_v6) != AF_UNSPEC) {
    target = _create_target(interf, &config->multicast_v6, false);
    if (target == NULL) {
      OONF_WARN(LOG_RFC5444, "Could not create multicast socket %s for interface %s",
        netaddr_to_string(&buf, &config->multicast_v6), interf->name);
      interf->multicast6 = old;
      old = NULL;
    }
    else {
      interf->multicast6 = target;
    }
  }
  if (old) {
    _destroy_target(old);
  }
}